

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

int main(void)

{
  SessionWriter *this;
  pthread_mutex_t *ppVar1;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> aVar3;
  int iVar4;
  size_t sVar5;
  Session *pSVar6;
  undefined8 uVar7;
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_03;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_04;
  long lVar8;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_08;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_09;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_10;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_11;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_12;
  char *__end;
  long *in_FS_OFFSET;
  timespec ts;
  undefined1 local_558 [32];
  undefined1 local_538 [16];
  _Alloc_hider local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  uint64_t local_4c8;
  _Alloc_hider local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  undefined1 local_480 [16];
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  uint64_t local_410;
  _Alloc_hider local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  uint64_t local_358;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [16];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  uint64_t local_2a0;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [16];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  uint64_t local_1e8;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint64_t local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
    main_cold_1();
    in_RDX = extraout_RDX_06;
  }
  this = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (0x20 < *(ushort *)(in_FS_OFFSET[-7] + 0x88)) {
LAB_00102cb2:
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_4();
      in_RDX = extraout_RDX_07;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x41) {
      if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558)
          ;
          main_cold_5();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_1a0._0_8_ = 0;
        local_1a0._8_2_ = debug;
        local_190._M_p = (pointer)&local_180;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
        local_170._M_p = (pointer)&local_160;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
        local_150._M_p = (pointer)&local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                   ,"");
        local_130 = 9;
        local_128._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Hello","");
        local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
        local_108._M_p = (pointer)&local_f8;
        sVar5 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,local_558,local_558 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_001040fe;
        local_1a0._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_1a0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_p != &local_118) {
          operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
        main_cold_6();
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      binlog::SessionWriter::addEvent<>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_558._0_8_ * 1000000000 + local_558._8_8_);
      in_RDX = extraout_RDX_00;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_7();
      in_RDX = extraout_RDX_08;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558)
          ;
          main_cold_8();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_258._0_8_ = 0;
        local_258._8_2_ = info;
        local_248._M_p = (pointer)&local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"main","");
        local_228._M_p = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"main","");
        local_208._M_p = (pointer)&local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                   ,"");
        local_1e8 = 0xb;
        local_1e0._M_p = (pointer)&local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Hello","");
        local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
        local_1c0._M_p = (pointer)&local_1b0;
        sVar5 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,local_558,local_558 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_00104105;
        local_258._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_258,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_p != &local_1b0) {
          operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_p != &local_1d0) {
          operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_p != &local_1f8) {
          operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_p != &local_218) {
          operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_p != &local_238) {
          operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
        main_cold_9();
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      binlog::SessionWriter::addEvent<>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_558._0_8_ * 1000000000 + local_558._8_8_);
      in_RDX = extraout_RDX_01;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_10();
      in_RDX = extraout_RDX_09;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x101) {
      if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558)
          ;
          main_cold_11();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_310._0_8_ = 0;
        local_310._8_2_ = warning;
        local_300._M_p = (pointer)&local_2f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"main","");
        local_2e0._M_p = (pointer)&local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"main","");
        local_2c0._M_p = (pointer)&local_2b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                   ,"");
        local_2a0 = 0xd;
        local_298._M_p = (pointer)&local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Hello","");
        local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
        local_278._M_p = (pointer)&local_268;
        sVar5 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,local_558,local_558 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_0010410c;
        local_310._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_310,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_p != &local_288) {
          operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_p != &local_2b0) {
          operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_p != &local_2d0) {
          operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_p != &local_2f0) {
          operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
        main_cold_12();
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      binlog::SessionWriter::addEvent<>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_558._0_8_ * 1000000000 + local_558._8_8_);
      in_RDX = extraout_RDX_02;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_13();
      in_RDX = extraout_RDX_10;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
      if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558)
          ;
          main_cold_14();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_3c8._0_8_ = 0;
        local_3c8._8_2_ = error;
        local_3b8._M_p = (pointer)&local_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"main","");
        local_398._M_p = (pointer)&local_388;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"main","");
        local_378._M_p = (pointer)&local_368;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_378,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                   ,"");
        local_358 = 0xf;
        local_350._M_p = (pointer)&local_340;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Hello","");
        local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
        local_330._M_p = (pointer)&local_320;
        sVar5 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,local_558,local_558 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_00104113;
        local_3c8._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_3c8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_p != &local_340) {
          operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_p != &local_368) {
          operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_p != &local_388) {
          operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
        main_cold_15();
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      binlog::SessionWriter::addEvent<>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_558._0_8_ * 1000000000 + local_558._8_8_);
      in_RDX = extraout_RDX_03;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_16();
      in_RDX = extraout_RDX_11;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x401) {
      if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558)
          ;
          main_cold_17();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_480._0_8_ = 0;
        local_480._8_2_ = critical;
        local_470._M_p = (pointer)&local_460;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"main","");
        local_450._M_p = (pointer)&local_440;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"main","");
        local_430._M_p = (pointer)&local_420;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_430,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                   ,"");
        local_410 = 0x11;
        local_408._M_p = (pointer)&local_3f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Hello","");
        local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
        local_3e8._M_p = (pointer)&local_3d8;
        sVar5 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3e8,local_558,local_558 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_0010411a;
        local_480._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_480,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_p != &local_3d8) {
          operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_p != &local_3f8) {
          operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_p != &local_420) {
          operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_p != &local_440) {
          operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_p != &local_460) {
          operator_delete(local_470._M_p,local_460._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
        main_cold_18();
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      binlog::SessionWriter::addEvent<>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_558._0_8_ * 1000000000 + local_558._8_8_);
      in_RDX = extraout_RDX_04;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_19();
      in_RDX = extraout_RDX_12;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar6 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558)
          ;
          main_cold_20();
        }
        ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_538._0_8_ = 0;
        local_538._8_2_ = info;
        local_528._M_p = (pointer)&local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"main","");
        local_508._M_p = (pointer)&local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"main","");
        local_4e8._M_p = (pointer)&local_4d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
                   ,"");
        local_4c8 = 0x15;
        local_4c0._M_p = (pointer)&local_4b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"Result: {}","");
        local_558._0_2_ = 0x69;
        local_4a0._M_p = (pointer)&local_490;
        sVar5 = strlen(local_558);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a0,local_558,local_558 + sVar5);
        iVar4 = pthread_mutex_lock(ppVar1);
        if (iVar4 != 0) goto LAB_00104121;
        local_538._0_8_ = ppVar1[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_538,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
        _Var2._M_i = ppVar1[3].__align;
        ppVar1[3].__align = _Var2._M_i + 1;
        pthread_mutex_unlock(ppVar1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_p != &local_490) {
          operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_p != &local_4b0) {
          operator_delete(local_4c0._M_p,local_4b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_p != &local_4d8) {
          operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_p != &local_4f8) {
          operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_p != &local_518) {
          operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      }
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
        main_cold_21();
      }
      local_558._0_8_ = (pointer)0x0;
      local_558._8_8_ = 0;
      clock_gettime(0,(timespec *)local_558);
      lVar8 = local_558._0_8_ * 1000000000;
      local_558._0_4_ = 0x2a;
      binlog::SessionWriter::addEvent<int>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 lVar8 + local_558._8_8_,(int *)local_558);
      in_RDX = extraout_RDX_05;
    }
    binlog::consume<std::ostream>((ConsumeResult *)local_558,(binlog *)&std::cout,in_RDX);
    return 0;
  }
  if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_00102c77:
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
      main_cold_3();
    }
    local_558._0_8_ = (pointer)0x0;
    local_558._8_8_ = 0;
    clock_gettime(0,(timespec *)local_558);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_558._0_8_ * 1000000000 + local_558._8_8_);
    in_RDX = extraout_RDX;
    goto LAB_00102cb2;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_558);
    main_cold_2();
  }
  ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
  local_e8._0_8_ = 0;
  local_e8._8_2_ = trace;
  local_d8._M_p = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
  local_98._M_p = (pointer)&local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/Logging.cpp"
             ,"");
  local_78 = 7;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Hello","");
  local_558._0_8_ = local_558._0_8_ & 0xffffffffffffff00;
  local_50._M_p = (pointer)&local_40;
  sVar5 = strlen(local_558);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_558,local_558 + sVar5);
  iVar4 = pthread_mutex_lock(ppVar1);
  if (iVar4 == 0) {
    local_e8._0_8_ = ppVar1[3].__align;
    binlog::
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
    _Var2._M_i = ppVar1[3].__align;
    ppVar1[3].__align = _Var2._M_i + 1;
    pthread_mutex_unlock(ppVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    LOCK();
    UNLOCK();
    main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    goto LAB_00102c77;
  }
  iVar4 = std::__throw_system_error(iVar4);
LAB_001040fe:
  iVar4 = std::__throw_system_error(iVar4);
LAB_00104105:
  iVar4 = std::__throw_system_error(iVar4);
LAB_0010410c:
  iVar4 = std::__throw_system_error(iVar4);
LAB_00104113:
  iVar4 = std::__throw_system_error(iVar4);
LAB_0010411a:
  iVar4 = std::__throw_system_error(iVar4);
LAB_00104121:
  uVar7 = std::__throw_system_error(iVar4);
  if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
    operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

int main()
{
  BINLOG_TRACE("Hello");
  // Outputs: TRAC Hello
  BINLOG_DEBUG("Hello");
  // Outputs: DEBG Hello
  BINLOG_INFO("Hello");
  // Outputs: INFO Hello
  BINLOG_WARN("Hello");
  // Outputs: WARN Hello
  BINLOG_ERROR("Hello");
  // Outputs: ERRO Hello
  BINLOG_CRITICAL("Hello");
  // Outputs: CRIT Hello

  //[log
  BINLOG_INFO("Result: {}", 42);
  // Outputs: INFO Result: 42
  //]

  binlog::consume(std::cout);
  return 0;
}